

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O1

void timer_close_cb(uv_handle_t *timer)

{
  void *ptr;
  uv_handle_t *handle;
  void *pvVar1;
  uv_handle_t *puVar2;
  void *pvVar3;
  
  ptr = (void *)((long)&timer[-1].u + 8);
  handle = (uv_handle_t *)timer[-1].u.reserved[1];
  pvVar3 = handle[1].data;
  if (ptr == handle[1].data) {
    puVar2 = timer[7].next_closing;
    handle[1].data = puVar2;
    if ((puVar2 == (uv_handle_t *)0x0) && ((handle->flags & 3) != 0)) {
      uv__make_close_pending(handle);
    }
  }
  else {
    while (pvVar1 = *(void **)((long)pvVar3 + 0x318), pvVar1 != ptr) {
      pvVar3 = pvVar1;
      if (pvVar1 == (void *)0x0) {
        __assert_fail("last->previous != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/fs-poll.c"
                      ,0xfa,"void timer_close_cb(uv_handle_t *)");
      }
    }
    *(uv_handle_t **)((long)pvVar3 + 0x318) = timer[7].next_closing;
  }
  uv__free(ptr);
  return;
}

Assistant:

static void timer_close_cb(uv_handle_t* timer) {
  struct poll_ctx* ctx;
  struct poll_ctx* it;
  struct poll_ctx* last;
  uv_fs_poll_t* handle;

  ctx = container_of(timer, struct poll_ctx, timer_handle);
  handle = ctx->parent_handle;
  if (ctx == handle->poll_ctx) {
    handle->poll_ctx = ctx->previous;
    if (handle->poll_ctx == NULL && uv__is_closing(handle))
      uv__make_close_pending((uv_handle_t*)handle);
  } else {
    for (last = handle->poll_ctx, it = last->previous;
         it != ctx;
         last = it, it = it->previous) {
      assert(last->previous != NULL);
    }
    last->previous = ctx->previous;
  }
  uv__free(ctx);
}